

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  PrimRef *pPVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  size_t sVar6;
  ulong uVar7;
  undefined4 uVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  uint index;
  ulong uVar12;
  unsigned_long uVar13;
  size_t *psVar14;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  size_t local_50;
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar12 = r->_begin;
  uVar13 = r->_end;
  if (uVar12 < uVar13) {
    auVar15._8_4_ = 0xff800000;
    auVar15._0_8_ = 0xff800000ff800000;
    auVar15._12_4_ = 0xff800000;
    auVar16 = ZEXT1664(auVar15);
    auVar17._8_4_ = 0x7f800000;
    auVar17._0_8_ = 0x7f8000007f800000;
    auVar17._12_4_ = 0x7f800000;
    auVar18 = ZEXT1664(auVar17);
    sVar11 = 0;
    auVar25._8_4_ = 0xddccb9a2;
    auVar25._0_8_ = 0xddccb9a2ddccb9a2;
    auVar25._12_4_ = 0xddccb9a2;
    auVar26._8_4_ = 0x5dccb9a2;
    auVar26._0_8_ = 0x5dccb9a25dccb9a2;
    auVar26._12_4_ = 0x5dccb9a2;
    auVar21 = ZEXT1664(auVar17);
    auVar24 = ZEXT1664(auVar15);
    local_50 = k;
    do {
      uVar10 = uVar12 & 0xffffffff;
      pBVar1 = (this->super_Points).vertices.items;
      if (uVar10 < (pBVar1->super_RawBufferView).num) {
        psVar14 = &pBVar1[itime].super_RawBufferView.stride;
        sVar6 = itime;
        do {
          if (*(float *)(((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar10 + 0xc) < 0.0
             ) goto LAB_0125092b;
          auVar15 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar10);
          auVar17 = vcmpps_avx(auVar15,auVar25,2);
          auVar15 = vcmpps_avx(auVar15,auVar26,5);
          auVar15 = vorps_avx(auVar17,auVar15);
          uVar8 = vmovmskps_avx(auVar15);
          if ((char)uVar8 != '\0') goto LAB_0125092b;
          sVar6 = sVar6 + 1;
          psVar14 = psVar14 + 7;
        } while (sVar6 <= itime);
        psVar14 = &pBVar1[itime + 1].super_RawBufferView.stride;
        uVar7 = itime + 1;
        do {
          if (*(float *)(((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar10 + 0xc) < 0.0
             ) goto LAB_0125092b;
          auVar15 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar10);
          auVar17 = vcmpps_avx(auVar15,auVar25,2);
          auVar15 = vcmpps_avx(auVar15,auVar26,5);
          auVar15 = vorps_avx(auVar17,auVar15);
          uVar8 = vmovmskps_avx(auVar15);
          if ((char)uVar8 != '\0') goto LAB_0125092b;
          uVar7 = uVar7 + 1;
          psVar14 = psVar14 + 7;
        } while (uVar7 <= itime + 1);
        pcVar2 = pBVar1[itime].super_RawBufferView.ptr_ofs;
        lVar9 = pBVar1[itime].super_RawBufferView.stride * uVar12;
        auVar15 = *(undefined1 (*) [16])(pcVar2 + lVar9);
        auVar17 = ZEXT416((uint)(*(float *)(pcVar2 + lVar9 + 0xc) *
                                (this->super_Points).maxRadiusScale));
        auVar17 = vshufps_avx(auVar17,auVar17,0);
        auVar27 = vsubps_avx(auVar15,auVar17);
        aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
        auVar27._0_4_ = auVar15._0_4_ + auVar17._0_4_;
        auVar27._4_4_ = auVar15._4_4_ + auVar17._4_4_;
        auVar27._8_4_ = auVar15._8_4_ + auVar17._8_4_;
        auVar27._12_4_ = auVar15._12_4_ + auVar17._12_4_;
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar27,ZEXT416((uint)uVar12),0x30);
        auVar15 = vminps_avx(auVar18._0_16_,(undefined1  [16])aVar4);
        auVar18 = ZEXT1664(auVar15);
        auVar15 = vmaxps_avx(auVar16._0_16_,(undefined1  [16])aVar5);
        auVar16 = ZEXT1664(auVar15);
        auVar28._0_4_ = aVar4.x + aVar5.x;
        auVar28._4_4_ = aVar4.y + aVar5.y;
        auVar28._8_4_ = aVar4.z + aVar5.z;
        auVar28._12_4_ = aVar4.field_3.w + aVar5.field_3.w;
        auVar15 = vminps_avx(auVar21._0_16_,auVar28);
        auVar21 = ZEXT1664(auVar15);
        auVar15 = vmaxps_avx(auVar24._0_16_,auVar28);
        auVar24 = ZEXT1664(auVar15);
        sVar11 = sVar11 + 1;
        pPVar3 = prims->items;
        pPVar3[local_50].upper.field_0.field_1 = aVar5;
        pPVar3[local_50].lower.field_0.field_1 = aVar4;
        uVar13 = r->_end;
        local_50 = local_50 + 1;
      }
LAB_0125092b:
      aVar22 = auVar24._0_16_;
      aVar19 = auVar21._0_16_;
      aVar23 = auVar16._0_16_;
      aVar20 = auVar18._0_16_;
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar13);
  }
  else {
    aVar20.m128[2] = INFINITY;
    aVar20._0_8_ = 0x7f8000007f800000;
    aVar20.m128[3] = INFINITY;
    aVar23.m128[2] = -INFINITY;
    aVar23._0_8_ = 0xff800000ff800000;
    aVar23.m128[3] = -INFINITY;
    sVar11 = 0;
    aVar19 = aVar20;
    aVar22 = aVar23;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->end = sVar11;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }